

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetAggregateOption
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  undefined1 *puVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  int iVar4;
  long *plVar5;
  Message *pMVar6;
  undefined4 extraout_var;
  LogMessage *pLVar7;
  string *psVar8;
  UnknownFieldSet *this_01;
  size_type *psVar9;
  ulong *puVar10;
  long *plVar11;
  string serial;
  AggregateErrorCollector collector;
  Parser parser;
  AggregateOptionFinder finder;
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  undefined1 local_a8 [56];
  Parser local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  MessageLite *this_00;
  
  if ((this->uninterpreted_option_->_has_bits_[0] & 0x40) == 0) {
    std::operator+(&local_50,"Option \"",
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                    (option_field + 8));
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_50);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_c8.field_2._M_allocated_capacity = *psVar9;
      local_c8.field_2._8_8_ = plVar5[3];
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
    }
    else {
      local_c8.field_2._M_allocated_capacity = *psVar9;
      local_c8._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_c8._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_c8,**(ulong **)option_field);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110.field_2._8_8_ = plVar5[3];
      local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    }
    else {
      local_110.field_2._M_allocated_capacity = *psVar9;
      local_110._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_110._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_110);
    plVar11 = plVar5 + 2;
    if ((ParseInfoTree **)*plVar5 == (ParseInfoTree **)plVar11) {
      local_70.parse_info_tree_ = (ParseInfoTree *)*plVar11;
      local_70._24_8_ = plVar5[3];
      local_70.error_collector_ = (ErrorCollector *)&local_70.parse_info_tree_;
    }
    else {
      local_70.parse_info_tree_ = (ParseInfoTree *)*plVar11;
      local_70.error_collector_ = (ErrorCollector *)*plVar5;
    }
    local_70.finder_ = (Finder *)plVar5[1];
    *plVar5 = (long)plVar11;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_70,**(ulong **)option_field);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar5 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar9) {
      local_f0.field_2._M_allocated_capacity = *psVar9;
      local_f0.field_2._8_8_ = plVar5[3];
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
    }
    else {
      local_f0.field_2._M_allocated_capacity = *psVar9;
      local_f0._M_dataplus._M_p = (pointer)*plVar5;
    }
    local_f0._M_string_length = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_f0);
    psVar9 = (size_type *)(plVar5 + 2);
    if ((size_type *)*plVar5 == psVar9) {
      local_a8._16_8_ = *psVar9;
      local_a8._24_8_ = plVar5[3];
      local_a8._0_8_ = local_a8 + 0x10;
    }
    else {
      local_a8._16_8_ = *psVar9;
      local_a8._0_8_ = (size_type *)*plVar5;
    }
    local_a8._8_8_ = plVar5[1];
    *plVar5 = (long)psVar9;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    AddError(this->builder_,&this->options_to_interpret_->element_name,
             &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_a8);
    if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
      operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
      operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
    }
    if (local_70.error_collector_ != (ErrorCollector *)&local_70.parse_info_tree_) {
      operator_delete(local_70.error_collector_,
                      (ulong)&((local_70.parse_info_tree_)->locations_)._M_t._M_impl.field_0x1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_110._M_dataplus._M_p != &local_110.field_2) {
      operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
      operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    bVar3 = false;
  }
  else {
    pMVar6 = DynamicMessageFactory::GetPrototype
                       (&this->dynamic_factory_,*(Descriptor **)(option_field + 0x48));
    iVar4 = (*(pMVar6->super_MessageLite)._vptr_MessageLite[3])(pMVar6);
    this_00 = (MessageLite *)CONCAT44(extraout_var,iVar4);
    if (this_00 == (MessageLite *)0x0) {
      internal::LogMessage::LogMessage
                ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                 ,0x12e9);
      pLVar7 = internal::LogMessage::operator<<
                         ((LogMessage *)local_a8,"CHECK failed: dynamic.get() != NULL: ");
      pLVar7 = internal::LogMessage::operator<<(pLVar7,"Could not create an instance of ");
      FieldDescriptor::DebugString_abi_cxx11_(&local_f0,option_field);
      pLVar7 = internal::LogMessage::operator<<(pLVar7,&local_f0);
      internal::LogFinisher::operator=((LogFinisher *)&local_70,pLVar7);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
        operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
      }
      internal::LogMessage::~LogMessage((LogMessage *)local_a8);
    }
    puVar1 = (undefined1 *)((long)&local_f0.field_2 + 8);
    local_f0._M_dataplus._M_p = (pointer)&PTR__AggregateErrorCollector_0028f968;
    local_f0.field_2._M_allocated_capacity = 0;
    local_f0.field_2._8_8_ = local_f0.field_2._8_8_ & 0xffffffffffffff00;
    local_50._M_dataplus._M_p = (pointer)&PTR__Finder_0028f9b0;
    local_50._M_string_length = (size_type)this->builder_;
    local_f0._M_string_length = (size_type)puVar1;
    TextFormat::Parser::Parser(&local_70);
    local_70.error_collector_ = (ErrorCollector *)&local_f0;
    local_70.finder_ = (Finder *)&local_50;
    bVar3 = TextFormat::Parser::ParseFromString
                      (&local_70,this->uninterpreted_option_->aggregate_value_,(Message *)this_00);
    if (bVar3) {
      paVar2 = &local_110.field_2;
      local_110._M_string_length = 0;
      local_110.field_2._M_allocated_capacity =
           local_110.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_110._M_dataplus._M_p = (pointer)paVar2;
      if (this_00 == (MessageLite *)0x0) {
        __assert_fail("ptr_ != NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/./src/google/protobuf/stubs/common.h"
                      ,0x1e2,
                      "C *google::protobuf::internal::scoped_ptr<google::protobuf::Message>::operator->() const [C = google::protobuf::Message]"
                     );
      }
      MessageLite::SerializeToString(this_00,&local_110);
      if (*(int *)(option_field + 0x2c) == 0xb) {
        psVar8 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_
                           (unknown_fields,*(int *)(option_field + 0x28));
        std::__cxx11::string::_M_assign((string *)psVar8);
      }
      else {
        if (*(int *)(option_field + 0x2c) != 10) {
          internal::LogMessage::LogMessage
                    ((LogMessage *)local_a8,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.cc"
                     ,0x12fd);
          pLVar7 = internal::LogMessage::operator<<
                             ((LogMessage *)local_a8,
                              "CHECK failed: (option_field->type()) == (FieldDescriptor::TYPE_GROUP): "
                             );
          internal::LogFinisher::operator=((LogFinisher *)&local_c8,pLVar7);
          internal::LogMessage::~LogMessage((LogMessage *)local_a8);
        }
        this_01 = UnknownFieldSet::AddGroup(unknown_fields,*(int *)(option_field + 0x28));
        UnknownFieldSet::ParseFromArray
                  (this_01,local_110._M_dataplus._M_p,(int)local_110._M_string_length);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != paVar2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::operator+(&local_c8,"Error while parsing option value for \"",
                     *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                      option_field);
      plVar5 = (long *)std::__cxx11::string::append((char *)&local_c8);
      puVar10 = (ulong *)(plVar5 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar5 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar10) {
        local_110.field_2._M_allocated_capacity = *puVar10;
        local_110.field_2._8_8_ = plVar5[3];
        local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
      }
      else {
        local_110.field_2._M_allocated_capacity = *puVar10;
        local_110._M_dataplus._M_p = (pointer)*plVar5;
      }
      local_110._M_string_length = plVar5[1];
      *plVar5 = (long)puVar10;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      plVar5 = (long *)std::__cxx11::string::_M_append((char *)&local_110,local_f0._M_string_length)
      ;
      psVar9 = (size_type *)(plVar5 + 2);
      if ((size_type *)*plVar5 == psVar9) {
        local_a8._16_8_ = *psVar9;
        local_a8._24_8_ = plVar5[3];
        local_a8._0_8_ = local_a8 + 0x10;
      }
      else {
        local_a8._16_8_ = *psVar9;
        local_a8._0_8_ = (size_type *)*plVar5;
      }
      local_a8._8_8_ = plVar5[1];
      *plVar5 = (long)psVar9;
      plVar5[1] = 0;
      *(undefined1 *)(plVar5 + 2) = 0;
      AddError(this->builder_,&this->options_to_interpret_->element_name,
               &this->uninterpreted_option_->super_Message,OPTION_VALUE,(string *)local_a8);
      if ((undefined1 *)local_a8._0_8_ != local_a8 + 0x10) {
        operator_delete((void *)local_a8._0_8_,local_a8._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_110._M_dataplus._M_p != &local_110.field_2) {
        operator_delete(local_110._M_dataplus._M_p,local_110.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
    TextFormat::Parser::~Parser(&local_70);
    TextFormat::Finder::~Finder((Finder *)&local_50);
    local_f0._M_dataplus._M_p = (pointer)&PTR__AggregateErrorCollector_0028f968;
    if ((undefined1 *)local_f0._M_string_length != puVar1) {
      operator_delete((void *)local_f0._M_string_length,local_f0.field_2._8_8_ + 1);
    }
    io::ErrorCollector::~ErrorCollector((ErrorCollector *)&local_f0);
    if (this_00 != (MessageLite *)0x0) {
      (*this_00->_vptr_MessageLite[1])(this_00);
    }
  }
  return bVar3;
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetAggregateOption(
    const FieldDescriptor* option_field,
    UnknownFieldSet* unknown_fields) {
  if (!uninterpreted_option_->has_aggregate_value()) {
    return AddValueError("Option \"" + option_field->full_name() +
                         "\" is a message. To set the entire message, use "
                         "syntax like \"" + option_field->name() +
                         " = { <proto text format> }\". "
                         "To set fields within it, use "
                         "syntax like \"" + option_field->name() +
                         ".foo = value\".");
  }

  const Descriptor* type = option_field->message_type();
  scoped_ptr<Message> dynamic(dynamic_factory_.GetPrototype(type)->New());
  GOOGLE_CHECK(dynamic.get() != NULL)
      << "Could not create an instance of " << option_field->DebugString();

  AggregateErrorCollector collector;
  AggregateOptionFinder finder;
  finder.builder_ = builder_;
  TextFormat::Parser parser;
  parser.RecordErrorsTo(&collector);
  parser.SetFinder(&finder);
  if (!parser.ParseFromString(uninterpreted_option_->aggregate_value(),
                              dynamic.get())) {
    AddValueError("Error while parsing option value for \"" +
                  option_field->name() + "\": " + collector.error_);
    return false;
  } else {
    string serial;
    dynamic->SerializeToString(&serial);  // Never fails
    if (option_field->type() == FieldDescriptor::TYPE_MESSAGE) {
      unknown_fields->AddLengthDelimited(option_field->number(), serial);
    } else {
      GOOGLE_CHECK_EQ(option_field->type(),  FieldDescriptor::TYPE_GROUP);
      UnknownFieldSet* group = unknown_fields->AddGroup(option_field->number());
      group->ParseFromString(serial);
    }
    return true;
  }
}